

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_cache.c
# Opt level: O1

void slab_put_large(slab_cache *cache,slab *slab)

{
  size_t *psVar1;
  small_stats *psVar2;
  ulong uVar3;
  rlist *prVar4;
  quota *pqVar5;
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  
  slab_assert(cache,slab);
  if (cache->order_max + 1 != (uint)slab->order) {
    __assert_fail("slab->order == cache->order_max + 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_cache.c"
                  ,0x126,"void slab_put_large(struct slab_cache *, struct slab *)");
  }
  uVar3 = slab->size;
  prVar4 = (slab->next_in_cache).prev;
  prVar4->next = (slab->next_in_cache).next;
  ((slab->next_in_cache).next)->prev = prVar4;
  (slab->next_in_cache).next = &slab->next_in_cache;
  (slab->next_in_cache).prev = &slab->next_in_cache;
  psVar1 = &(cache->allocated).stats.total;
  *psVar1 = *psVar1 - uVar3;
  psVar2 = &(cache->allocated).stats;
  psVar2->used = psVar2->used - uVar3;
  if (0x3fffffffbff < uVar3) {
    __assert_fail("size < QUOTA_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                  ,0xa2,"ssize_t quota_release(struct quota *, size_t)");
  }
  if (uVar3 == 0) {
    __assert_fail("size_in_units",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                  ,0xa5,"ssize_t quota_release(struct quota *, size_t)");
  }
  pqVar5 = cache->arena->quota;
  do {
    uVar6 = pqVar5->value;
    uVar7 = (uint)(uVar3 + 0x3ff >> 10);
    if ((uint)uVar6 < uVar7) {
      __assert_fail("size_in_units <= used_in_units",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                    ,0xab,"ssize_t quota_release(struct quota *, size_t)");
    }
    LOCK();
    bVar8 = uVar6 == pqVar5->value;
    if (bVar8) {
      pqVar5->value = (ulong)((uint)uVar6 - uVar7) | uVar6 & 0xffffffff00000000;
    }
    UNLOCK();
  } while (!bVar8);
  memset(slab + 1,0x50,slab->size - 0x30);
  free(slab);
  return;
}

Assistant:

void
slab_put_large(struct slab_cache *cache, struct slab *slab)
{
	slab_assert(cache, slab);
	assert(slab->order == cache->order_max + 1);
	/*
	 * Free a huge slab right away, we have no
	 * further business to do with it.
	 */
	size_t slab_size = slab->size;
	slab_list_del(&cache->allocated, slab, next_in_cache);
	cache->allocated.stats.used -= slab_size;
	quota_release(cache->arena->quota, slab_size);
	slab_poison(slab);
	VALGRIND_MEMPOOL_FREE(cache, slab_data(slab));
	free(slab);
	return;
}